

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O1

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::remove_path(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *this,RBPath *path)

{
  bool bVar1;
  ulong *puVar2;
  ulong *puVar3;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *pRVar4;
  uintptr_t *puVar5;
  size_t sVar6;
  ulong *puVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool *pbVar13;
  size_t sVar14;
  ulong uVar15;
  RBStep *pRVar16;
  ulong uVar17;
  RBStep *pRVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  
  sVar6 = path->length;
  puVar2 = (path->path)._M_elems[sVar6 - 1].node.ptr.val;
  if (1 < *(ulong *)(*puVar2 & 0xfffffffffffffffe)) {
    (path->path)._M_elems[sVar6].node.ptr.val = (ulong *)(*puVar2 & 0xfffffffffffffffe);
    (path->path)._M_elems[sVar6].dir = true;
    path->length = sVar6 + 1;
  }
  sVar6 = path->length;
  uVar10 = *(path->path)._M_elems[sVar6 - 1].node.ptr.val & 0xfffffffffffffffe;
  if (1 < *(ulong *)(uVar10 + 8)) {
    pbVar13 = &(path->path)._M_elems[sVar6].dir;
    do {
      (((RBStep *)(pbVar13 + -8))->node).ptr.val = (ulong *)(uVar10 + 8);
      *pbVar13 = false;
      sVar6 = sVar6 + 1;
      uVar10 = *(ulong *)(uVar10 + 8) & 0xfffffffffffffffe;
      pbVar13 = pbVar13 + 0x10;
    } while (1 < *(ulong *)(uVar10 + 8));
    path->length = sVar6;
  }
  sVar6 = path->length;
  puVar3 = (path->path)._M_elems[sVar6 - 1].node.ptr.val;
  uVar10 = *puVar3;
  puVar7 = (ulong *)(uVar10 & 0xfffffffffffffffe);
  uVar15 = (ulong)((uint)uVar10 & 1);
  uVar10 = (*puVar7 & 0xfffffffffffffffe) + uVar15;
  if ((*puVar7 & 0xfffffffffffffffe) == 0) {
    uVar10 = uVar15;
  }
  *puVar3 = uVar10;
  uVar10 = puVar7[1];
  if ((path->path)._M_elems[sVar6 - 1].node.ptr.val != puVar2) {
    if ((*puVar2 & 0xfffffffffffffffe) == 0) {
      bVar8 = 0;
    }
    else {
      bVar8 = *(byte *)((*puVar2 & 0xfffffffffffffffe) + 8) & 1;
    }
    if (bVar8 != ((byte)puVar7[1] & 1)) {
      uVar15 = puVar7[1] & 0xfffffffffffffffe;
      if (bVar8 == 0) {
        puVar7[1] = uVar15;
      }
      else if (uVar15 == 0) {
        puVar7[1] = 1;
      }
      else {
        puVar7[1] = puVar7[1] | 1;
      }
    }
    *puVar7 = (ulong)((uint)*puVar7 & 1) |
              *(ulong *)(*puVar2 & 0xfffffffffffffffe) & 0xfffffffffffffffe;
    puVar7[1] = (ulong)((uint)puVar7[1] & 1) |
                *(ulong *)((*puVar2 & 0xfffffffffffffffe) + 8) & 0xfffffffffffffffe;
    *puVar2 = (ulong)((uint)*puVar2 & 1) | (ulong)puVar7;
    RBPath::fixup(path,true);
  }
  if ((uVar10 & 1) == 0) {
    pRVar4 = (RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *)(path->path)._M_elems[path->length - 1].node.ptr.val;
    sVar6 = path->length;
    while (sVar14 = sVar6 - 1, pRVar4 != this) {
      pRVar18 = (path->path)._M_elems + (sVar6 - 1);
      pRVar16 = (path->path)._M_elems + (sVar6 - 2);
      uVar10 = *(pRVar16->node).ptr.val & 0xfffffffffffffffe;
      bVar1 = (path->path)._M_elems[sVar6 - 1].dir;
      lVar20 = (ulong)bVar1 * 8;
      uVar15 = *(ulong *)(uVar10 + lVar20) & 0xfffffffffffffffe;
      uVar22 = (uint)*(ulong *)(uVar10 + lVar20);
      if ((uVar15 == 0) || ((*(byte *)(uVar15 + 8) & 1) == 0)) {
        uVar17 = *(ulong *)(uVar15 + lVar20) & 0xfffffffffffffffe;
        if ((uVar17 != 0) && ((*(byte *)(uVar17 + 8) & 1) != 0)) {
          uVar12 = *(ulong *)(uVar15 + (ulong)(bVar1 ^ 1) * 8);
          uVar11 = (ulong)((uint)uVar12 & 1);
          uVar21 = uVar11 | uVar10;
          if (uVar10 == 0) {
            uVar21 = uVar11;
          }
          *(ulong *)(uVar15 + (ulong)(bVar1 ^ 1) * 8) = uVar21;
          *(ulong *)(uVar10 + lVar20) =
               (ulong)((uint)*(undefined8 *)(uVar10 + lVar20) & 1) | uVar12 & 0xfffffffffffffffe;
          puVar5 = (pRVar16->node).ptr.val;
          *puVar5 = (uint)*puVar5 & 1 | uVar15;
          if ((uVar17 != 0) && ((*(byte *)(uVar17 + 8) & 1) != 0)) {
            *(byte *)(uVar17 + 8) = *(byte *)(uVar17 + 8) & 0xfe;
          }
          if (uVar10 == 0) {
            bVar8 = 0;
          }
          else {
            bVar8 = *(byte *)(uVar10 + 8) & 1;
          }
          if (uVar15 == 0) {
            bVar9 = 0;
          }
          else {
            bVar9 = *(byte *)(uVar15 + 8) & 1;
          }
          if (bVar8 != bVar9) {
            uVar17 = *(ulong *)(uVar15 + 8) & 0xfffffffffffffffe;
            if (bVar8 == 0) {
              *(ulong *)(uVar15 + 8) = uVar17;
            }
            else if (uVar17 == 0) {
              *(undefined8 *)(uVar15 + 8) = 1;
            }
            else {
              *(ulong *)(uVar15 + 8) = *(ulong *)(uVar15 + 8) | 1;
            }
          }
LAB_0023d815:
          if (uVar10 == 0) {
            return true;
          }
          if ((*(byte *)(uVar10 + 8) & 1) == 0) {
            return true;
          }
          *(byte *)(uVar10 + 8) = *(byte *)(uVar10 + 8) & 0xfe;
          return true;
        }
        lVar19 = (ulong)(bVar1 ^ 1) * 8;
        uVar17 = *(ulong *)(uVar15 + lVar19) & 0xfffffffffffffffe;
        if ((uVar17 != 0) && ((*(byte *)(uVar17 + 8) & 1) != 0)) {
          uVar11 = *(ulong *)(uVar17 + lVar19) & 0xfffffffffffffffe;
          uVar12 = *(ulong *)(uVar17 + lVar20);
          uVar23 = (ulong)(uVar22 & 1);
          uVar21 = uVar11 + uVar23;
          if (uVar11 == 0) {
            uVar21 = uVar23;
          }
          *(ulong *)(uVar10 + lVar20) = uVar21;
          *(ulong *)(uVar15 + lVar19) =
               (ulong)((uint)*(undefined8 *)(uVar15 + lVar19) & 1) | uVar12 & 0xfffffffffffffffe;
          *(ulong *)(uVar17 + lVar19) = (uint)*(undefined8 *)(uVar17 + lVar19) & 1 | uVar10;
          *(ulong *)(uVar17 + lVar20) = (uint)*(undefined8 *)(uVar17 + lVar20) & 1 | uVar15;
          puVar2 = (pRVar16->node).ptr.val;
          *puVar2 = (uint)*puVar2 & 1 | uVar17;
          if (uVar10 == 0) {
            bVar8 = 0;
          }
          else {
            bVar8 = *(byte *)(uVar10 + 8) & 1;
          }
          if (uVar17 == 0) {
            bVar9 = 0;
          }
          else {
            bVar9 = *(byte *)(uVar17 + 8) & 1;
          }
          if (bVar8 != bVar9) {
            uVar15 = *(ulong *)(uVar17 + 8) & 0xfffffffffffffffe;
            if (bVar8 == 0) {
              *(ulong *)(uVar17 + 8) = uVar15;
            }
            else if (uVar15 == 0) {
              *(undefined8 *)(uVar17 + 8) = 1;
            }
            else {
              *(ulong *)(uVar17 + 8) = *(ulong *)(uVar17 + 8) | 1;
            }
          }
          goto LAB_0023d815;
        }
        if ((uVar10 != 0) && ((*(byte *)(uVar10 + 8) & 1) != 0)) {
          if ((uVar10 != 0) && ((*(byte *)(uVar10 + 8) & 1) != 0)) {
            *(byte *)(uVar10 + 8) = *(byte *)(uVar10 + 8) & 0xfe;
          }
          if ((uVar15 != 0) && ((*(byte *)(uVar15 + 8) & 1) != 0)) {
            return true;
          }
          if (*(ulong *)(uVar15 + 8) < 2) {
            *(undefined8 *)(uVar15 + 8) = 1;
            return true;
          }
          *(ulong *)(uVar15 + 8) = *(ulong *)(uVar15 + 8) | 1;
          return true;
        }
        if ((uVar15 == 0) || ((*(byte *)(uVar15 + 8) & 1) == 0)) {
          if (*(ulong *)(uVar15 + 8) < 2) {
            *(undefined8 *)(uVar15 + 8) = 1;
          }
          else {
            *(ulong *)(uVar15 + 8) = *(ulong *)(uVar15 + 8) | 1;
          }
        }
      }
      else {
        lVar19 = (ulong)(bVar1 ^ 1) * 8;
        uVar12 = *(ulong *)(uVar15 + lVar19) & 0xfffffffffffffffe;
        uVar21 = (ulong)(uVar22 & 1);
        uVar17 = uVar12 + uVar21;
        if (uVar12 == 0) {
          uVar17 = uVar21;
        }
        *(ulong *)(uVar10 + lVar20) = uVar17;
        *(ulong *)(uVar15 + lVar19) = (uint)*(undefined8 *)(uVar15 + lVar19) & 1 | uVar10;
        if ((uVar10 == 0) || ((*(byte *)(uVar10 + 8) & 1) == 0)) {
          uVar17 = *(ulong *)(uVar10 + 8) | 1;
          if (*(ulong *)(uVar10 + 8) < 2) {
            uVar17 = 1;
          }
          *(ulong *)(uVar10 + 8) = uVar17;
        }
        if ((uVar15 != 0) && ((*(byte *)(uVar15 + 8) & 1) != 0)) {
          *(byte *)(uVar15 + 8) = *(byte *)(uVar15 + 8) & 0xfe;
        }
        puVar2 = (pRVar16->node).ptr.val;
        *puVar2 = (uint)*puVar2 & 1 | uVar15;
        path->length = sVar14;
        uVar10 = *(path->path)._M_elems[sVar6 - 2].node.ptr.val & 0xfffffffffffffffe;
        if (1 < *(ulong *)(uVar10 + lVar19)) {
          (pRVar18->node).ptr.val = (uintptr_t *)(uVar10 + lVar19);
          pRVar18->dir = bVar1;
          path->length = sVar6;
          sVar14 = sVar6;
        }
        (path->path)._M_elems[sVar14].node.ptr.val =
             (uintptr_t *)
             ((*(path->path)._M_elems[sVar14 - 1].node.ptr.val & 0xfffffffffffffffe) + lVar19);
        (path->path)._M_elems[sVar14].dir = bVar1;
        sVar14 = sVar14 + 1;
      }
      path->length = sVar14;
      sVar6 = sVar14;
      pRVar4 = (RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                *)(path->path)._M_elems[sVar14 - 1].node.ptr.val;
    }
  }
  return true;
}

Assistant:

bool remove_path(RBPath& path)
    {
      ChildRef splice = path.curr();
      SNMALLOC_ASSERT(!(splice.is_null()));

      debug_log("Removing", path);

      /*
       * Find immediately smaller leaf element (rightmost descendant of left
       * child) to serve as the replacement for this node.  We may not have a
       * left subtree, so this may not move the path at all.
       */
      path.move(true);
      while (path.move(false))
      {}

      K curr = path.curr();

      {
        // Locally extract right-child-less replacement, replacing it with its
        // left child, if any
        K child = get_dir(true, path.curr());
        // Unlink target replacing with possible child.
        path.curr() = child;
      }

      bool leaf_red = Rep::is_red(curr);

      if (path.curr() != splice)
      {
        // If we had a left child, replace ourselves with the extracted value
        // from above
        Rep::set_red(curr, Rep::is_red(splice));
        get_dir(true, curr) = K{get_dir(true, splice)};
        get_dir(false, curr) = K{get_dir(false, splice)};
        splice = curr;
        path.fixup();
      }

      debug_log("Splice done", path);

      // TODO: Clear node contents?

      // Red leaf removal requires no rebalancing.
      if (leaf_red)
        return true;

      // Now in the double black case.
      // End of path is considered double black, that is, one black element
      // shorter than satisfies the invariant. The following algorithm moves up
      // the path until it finds a close red element or the root. If we convert
      // the tree to one, in which the root is double black, then the algorithm
      // is complete, as there is nothing to be out of balance with. Otherwise,
      // we are searching for nearby red elements so we can rotate the tree to
      // rebalance. The following slides nicely cover the case analysis below
      //   https://www.cs.purdue.edu/homes/ayg/CS251/slides/chap13c.pdf
      while (path.curr() != ChildRef(H{&root}))
      {
        K parent = path.parent();
        bool cur_dir = path.curr_dir();
        K sibling = get_dir(!cur_dir, parent);

        /* Handle red sibling case.
         * This performs a rotation to give a black sibling.
         *
         *         p                           s(b)
         *        / \                         /   \
         *       c   s(r)        -->         p(r)  m
         *          /  \                    / \
         *         n    m                  c   n
         *
         * By invariant we know that p, n and m are all initially black.
         */
        if (Rep::is_red(sibling))
        {
          debug_log("Red sibling", path, path.parent());
          K nibling = get_dir(cur_dir, sibling);
          get_dir(!cur_dir, parent) = nibling;
          get_dir(cur_dir, sibling) = parent;
          Rep::set_red(parent, true);
          Rep::set_red(sibling, false);
          path.parent() = sibling;
          // Manually fix path.  Using path.fixup would alter the complexity
          // class.
          path.pop();
          path.move(cur_dir);
          path.move_inc_null(cur_dir);
          path.fixup(false);
          debug_log("Red sibling - done", path, path.parent());
          continue;
        }

        /* Handle red nibling case 1.
         *          <p>                  <s>
         *          / \                  / \
         *         c   s         -->    p   rn
         *            / \              / \
         *          on   rn           c   on
         */
        if (Rep::is_red(get_dir(!cur_dir, sibling)))
        {
          debug_log("Red nibling 1", path, path.parent());
          K r_nibling = get_dir(!cur_dir, sibling);
          K o_nibling = get_dir(cur_dir, sibling);
          get_dir(cur_dir, sibling) = parent;
          get_dir(!cur_dir, parent) = o_nibling;
          path.parent() = sibling;
          Rep::set_red(r_nibling, false);
          Rep::set_red(sibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 1 - done", path, path.parent());
          break;
        }

        /* Handle red nibling case 2.
         *         <p>                   <rn>
         *         / \                  /    \
         *        c   s         -->    p      s
         *           / \              / \    / \
         *         rn   on           c  rno rns on
         *         / \
         *       rno  rns
         */
        if (Rep::is_red(get_dir(cur_dir, sibling)))
        {
          debug_log("Red nibling 2", path, path.parent());
          K r_nibling = get_dir(cur_dir, sibling);
          K r_nibling_same = get_dir(cur_dir, r_nibling);
          K r_nibling_opp = get_dir(!cur_dir, r_nibling);
          get_dir(!cur_dir, parent) = r_nibling_same;
          get_dir(cur_dir, sibling) = r_nibling_opp;
          get_dir(cur_dir, r_nibling) = parent;
          get_dir(!cur_dir, r_nibling) = sibling;
          path.parent() = r_nibling;
          Rep::set_red(r_nibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 2 - done", path, path.parent());
          break;
        }

        // Handle black sibling and niblings, and red parent.
        if (Rep::is_red(parent))
        {
          debug_log("Black sibling and red parent case", path, path.parent());
          Rep::set_red(parent, false);
          Rep::set_red(sibling, true);
          debug_log(
            "Black sibling and red parent case - done", path, path.parent());
          break;
        }
        // Handle black sibling and niblings and black parent.
        debug_log(
          "Black sibling, niblings and black parent case", path, path.parent());
        Rep::set_red(sibling, true);
        path.pop();
        invariant(path.curr());
        debug_log(
          "Black sibling, niblings and black parent case - done",
          path,
          path.curr());
      }
      return true;
    }